

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::PaddedSobolSampler::Get2D(PaddedSobolSampler *this)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Float FVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar14 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_var [60];
  
  uVar6 = this->samplesPerPixel;
  uVar5 = this->dimension;
  uVar4 = (long)*Options ^
          (long)(int)uVar5 << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar4 = (uVar4 >> 0x1f ^ uVar4) * 0x7fb5d329728ea185;
  uVar11 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
  uVar4 = uVar11 >> 0x21 ^ uVar11;
  uVar3 = this->sampleIndex;
  uVar9 = uVar6 - 1 >> 1 | uVar6 - 1;
  uVar9 = uVar9 >> 2 | uVar9;
  uVar9 = uVar9 >> 4 | uVar9;
  uVar9 = uVar9 >> 8 | uVar9;
  uVar9 = uVar9 >> 0x10 | uVar9;
  uVar7 = (uint)(uVar4 >> 8);
  do {
    uVar3 = (uVar3 ^ (uint)uVar4) * -0x1e8f76c3 ^ (uint)(uVar4 >> 0x10) & 0xffff;
    uVar3 = ((uVar3 & uVar9) >> 4 ^ uVar7 & 0xffffff ^ uVar3) * 0x929eb3f ^
            (uint)(uVar4 >> 0x17) & 0x1ff;
    uVar3 = ((uVar3 & uVar9) >> 1 ^ uVar3) * ((uint)(uVar4 >> 0x1b) & 0x1f | 1) * 0x6935fa69;
    uVar3 = ((uVar3 & uVar9) >> 0xb ^ uVar3) * 0x74dcb303;
    uVar3 = ((uVar3 & uVar9) >> 2 ^ uVar3) * -0x61afe33d;
    uVar3 = ((uVar3 & uVar9) >> 2 ^ uVar3) * -0x379f5c21 & uVar9;
    uVar3 = uVar3 >> 5 ^ uVar3;
  } while (uVar6 <= uVar3);
  uVar6 = (uVar3 + (uint)uVar4) % uVar6;
  this->dimension = uVar5 + 2;
  if (this->randomizeStrategy != CranleyPatterson) {
    FVar12 = SampleDimension(this,0,uVar6,uVar7);
    auVar14._0_4_ = SampleDimension(this,1,uVar6,(uint32_t)(uVar11 >> 0x20));
    auVar14._4_60_ = extraout_var;
    auVar13 = auVar14._0_16_;
    auVar15._4_4_ = extraout_XMM0_Db;
    auVar15._0_4_ = FVar12;
    auVar15._8_4_ = extraout_XMM0_Dc;
    auVar15._12_4_ = extraout_XMM0_Dd;
LAB_0026ca46:
    auVar15 = vinsertps_avx(auVar15,auVar13,0x10);
    return (Point2f)auVar15._0_8_;
  }
  if ((-1 < (int)uVar5) &&
     (TVar1 = (this->pixel).super_Tuple2<pbrt::Point2,_int>,
     ((ulong)TVar1 & 0x8000000080000000) == 0)) {
    uVar3 = 0;
    if (uVar6 != 0) {
      puVar8 = &SobolMatrices32;
      uVar7 = uVar6;
      do {
        if ((uVar7 & 1) != 0) {
          uVar3 = uVar3 ^ *puVar8;
        }
        puVar8 = puVar8 + 1;
        bVar2 = 1 < uVar7;
        uVar7 = (int)uVar7 >> 1;
      } while (bVar2);
    }
    if (-2 < (int)uVar5) {
      uVar7 = TVar1.x & 0x7f;
      iVar10 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                           (BlueNoiseTextures +
                                                           ((ulong)TVar1 >> 0x20 & 0x7f) * 2 +
                                                           (ulong)(uVar7 << 8) +
                                                           (ulong)(uVar5 % 0x30 << 0xf)) / 65535.0)
                                                 * 4.2949673e+09)));
      auVar15 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,uVar3 + iVar10);
      iVar10 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                           (BlueNoiseTextures +
                                                           ((ulong)TVar1 >> 0x20 & 0x7f) * 2 +
                                                           (ulong)(uVar7 << 8) +
                                                           (ulong)((uVar5 + 1) % 0x30 << 0xf)) /
                                                  65535.0) * 4.2949673e+09)));
      if (uVar6 == 0) {
        uVar5 = 0;
      }
      else {
        puVar8 = &DAT_0098b730;
        uVar5 = 0;
        do {
          if ((uVar6 & 1) != 0) {
            uVar5 = uVar5 ^ *puVar8;
          }
          puVar8 = puVar8 + 1;
          bVar2 = 1 < uVar6;
          uVar6 = (int)uVar6 >> 1;
        } while (bVar2);
      }
      auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(auVar15._0_4_ * 2.3283064e-10)));
      auVar13 = vcvtusi2ss_avx512f(in_XMM3,uVar5 + iVar10);
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10)));
      goto LAB_0026ca46;
    }
  }
  LogFatal<char_const(&)[42]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bluenoise.h"
             ,0x1a,"Check failed: %s",(char (*) [42])"textureIndex >= 0 && p.x >= 0 && p.y >= 0");
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension;
        dimension += 2;
        // Return randomized 2D Sobol' sample
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            // Return 2D sample randomized with Cranley-Patterson rotation
            return {SobolSample(index, 0, CranleyPattersonRotator(BlueNoise(dim, pixel))),
                    SobolSample(index, 1,
                                CranleyPattersonRotator(BlueNoise(dim + 1, pixel)))};

        } else
            return {SampleDimension(0, index, hash >> 8),
                    SampleDimension(1, index, hash >> 32)};
    }